

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

int N_VConstrMask_SensWrapper(N_Vector c,N_Vector x,N_Vector m)

{
  int iVar1;
  int local_28;
  int tmp;
  int test;
  int i;
  N_Vector m_local;
  N_Vector x_local;
  N_Vector c_local;
  
  local_28 = 1;
  for (tmp = 0; tmp < *(int *)((long)x->content + 8); tmp = tmp + 1) {
    iVar1 = N_VConstrMask(c,*(N_Vector *)(*x->content + (long)tmp * 8),
                          *(N_Vector *)(*m->content + (long)tmp * 8));
    if (iVar1 != 1) {
      local_28 = 0;
    }
  }
  return local_28;
}

Assistant:

booleantype N_VConstrMask_SensWrapper(N_Vector c, N_Vector x, N_Vector m)
{
  int i;
  booleantype test, tmp;

  test = SUNTRUE;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VConstrMask(c, NV_VEC_SW(x,i), NV_VEC_SW(m,i));
    if (tmp != SUNTRUE) test = SUNFALSE;
  }

  return(test);
}